

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O1

void test_immediate_read_error_for_get_extended_length(void)

{
  cio_error cVar1;
  void *__s;
  ulong __size;
  long lVar2;
  _func_cio_error_cio_buffered_stream_ptr_cio_read_buffer_ptr_size_t_cio_buffered_stream_read_handler_t_void_ptr
  *read_at_least_fakes [3];
  _func_cio_error_cio_buffered_stream_ptr_cio_read_buffer_ptr_size_t_cio_buffered_stream_read_handler_t_void_ptr
  *local_98;
  code *pcStack_90;
  code *local_88;
  ws_frame local_78;
  undefined4 local_58;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined4 local_44;
  undefined2 local_40;
  
  lVar2 = 0;
  while( true ) {
    __size = (ulong)*(uint *)((long)&DAT_00111fd8 + lVar2);
    __s = malloc(__size);
    memset(__s,0x61,__size);
    local_78.frame_type = CIO_WEBSOCKET_TEXT_FRAME;
    local_78.direction = FROM_CLIENT;
    local_78.last_frame = true;
    local_78.rsv = false;
    local_58 = 8;
    local_54 = 0;
    uStack_4c = 0;
    local_44 = 0;
    local_40 = 1;
    local_78.data = __s;
    local_78.data_length = __size;
    serialize_frames(&local_78,2);
    local_88 = bs_read_at_least_immediate_error;
    local_98 = bs_read_at_least_from_buffer;
    pcStack_90 = bs_read_at_least_from_buffer;
    cio_buffered_stream_read_at_least_fake.custom_fake_seq_len = 3;
    cio_buffered_stream_read_at_least_fake.custom_fake_seq = &local_98;
    cVar1 = cio_websocket_read_message(ws,read_handler,(void *)0x0);
    UnityAssertEqualNumber
              (0,(long)cVar1,"Could not start reading a message!",0x442,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)read_handler_fake.call_count,"read_handler was not called",0x444,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((UNITY_INT)ws,(UNITY_INT)read_handler_fake.arg0_val,
               "websocket parameter of read_handler not correct",0x445,UNITY_DISPLAY_STYLE_HEX64);
    if (read_handler_fake.arg1_val != (void *)0x0) {
      UnityFail("context parameter of read_handler not correct",0x446);
    }
    UnityAssertEqualNumber
              (1,(long)read_handler_fake.arg2_val,"error parameter of read_handler not correct",
               0x447,UNITY_DISPLAY_STYLE_INT);
    if (read_handler_fake.arg4_val != (uint8_t *)0x0) break;
    UnityAssertEqualNumber
              (0,read_handler_fake.arg5_val,"length parameter of read_handler not correct",0x449,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)on_error_fake.call_count,"error callback was called",1099,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((UNITY_INT)ws,(UNITY_INT)on_error_fake.arg0_val,
               "ws parameter in error callback not correct",0x44c,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (-0x62,(long)on_error_fake.arg1_val,"error callback called with wrong status code",
               0x44d,UNITY_DISPLAY_STYLE_INT);
    if (__s != (void *)0x0) {
      free(__s);
    }
    free(ws);
    setUp();
    lVar2 = lVar2 + 4;
    if (lVar2 != 4) {
      return;
    }
  }
  UnityFail("data parameter of read_handler not correct",0x448);
}

Assistant:

static void test_immediate_read_error_for_get_extended_length(void)
{
	uint32_t frame_sizes[] = {30000, 70000};

	for (unsigned int i = 0; i < ARRAY_SIZE(frame_sizes); i++) {
		unsigned int frame_type = CIO_WEBSOCKET_TEXT_FRAME;

		uint32_t frame_size = frame_sizes[i];
		char *data = malloc(frame_size);
		memset(data, 'a', frame_size);
		struct ws_frame frames[] = {
		    {.frame_type = frame_type, .direction = FROM_CLIENT, .data = data, .data_length = frame_size, .last_frame = true, .rsv = false},
		    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = FROM_CLIENT, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
		};

		serialize_frames(frames, ARRAY_SIZE(frames));
		enum cio_error (*read_at_least_fakes[])(struct cio_buffered_stream *, struct cio_read_buffer *, size_t, cio_buffered_stream_read_handler_t, void *) = {
		    bs_read_at_least_from_buffer,
		    bs_read_at_least_from_buffer,
		    bs_read_at_least_immediate_error};

		SET_CUSTOM_FAKE_SEQ(cio_buffered_stream_read_at_least, read_at_least_fakes, ARRAY_SIZE(read_at_least_fakes))

		enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

		TEST_ASSERT_EQUAL_MESSAGE(1, read_handler_fake.call_count, "read_handler was not called");
		TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, read_handler_fake.arg0_val, "websocket parameter of read_handler not correct");
		TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_val, "context parameter of read_handler not correct");
		TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_val, "error parameter of read_handler not correct");
		TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg4_val, "data parameter of read_handler not correct");
		TEST_ASSERT_EQUAL_MESSAGE(0, read_handler_fake.arg5_val, "length parameter of read_handler not correct");

		TEST_ASSERT_EQUAL_MESSAGE(1, on_error_fake.call_count, "error callback was called");
		TEST_ASSERT_EQUAL_MESSAGE(ws, on_error_fake.arg0_val, "ws parameter in error callback not correct");
		TEST_ASSERT_EQUAL_MESSAGE(CIO_ADDRESS_IN_USE, on_error_fake.arg1_val, "error callback called with wrong status code");

		if (data) {
			free(data);
		}

		free(ws);
		setUp();
	}
}